

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QRingChunk>::reallocateAndGrow
          (QArrayDataPointer<QRingChunk> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QRingChunk> *old)

{
  Data *pDVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  QRingChunk *pQVar5;
  undefined1 *puVar6;
  QRingChunk *data;
  long lVar7;
  QRingChunk *pQVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QRingChunk> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<QRingChunk> *)0x0 && where == GrowsAtEnd) &&
       (pDVar1 = this->d, pDVar1 != (Data *)0x0)) && (0 < n)) &&
     ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QtPrivate::QMovableArrayOps<QRingChunk>::reallocate
                ((QMovableArrayOps<QRingChunk> *)this,
                 n + this->size +
                 ((long)((long)this->ptr -
                        ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
                        ) >> 3) * -0x3333333333333333,Grow);
      return;
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QRingChunk *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_48,this,n,where);
    if (local_48.ptr == (QRingChunk *)0x0 && 0 < n) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
    }
    else {
      if (this->size != 0) {
        lVar7 = this->size + (n >> 0x3f & n);
        if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<QRingChunk> *)0x0)) ||
           (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          if (0 < lVar7) {
            pQVar8 = this->ptr;
            pQVar5 = pQVar8 + lVar7;
            do {
              pDVar2 = (pQVar8->chunk).d.d;
              local_48.ptr[local_48.size].chunk.d.d = pDVar2;
              local_48.ptr[local_48.size].chunk.d.ptr = (pQVar8->chunk).d.ptr;
              local_48.ptr[local_48.size].chunk.d.size = (pQVar8->chunk).d.size;
              if (pDVar2 != (Data *)0x0) {
                LOCK();
                (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
                     (__atomic_base<int>)
                     ((__int_type_conflict)
                      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
                UNLOCK();
              }
              qVar4 = pQVar8->tailOffset;
              local_48.ptr[local_48.size].headOffset = pQVar8->headOffset;
              local_48.ptr[local_48.size].tailOffset = qVar4;
              pQVar8 = pQVar8 + 1;
              local_48.size = local_48.size + 1;
            } while (pQVar8 < pQVar5);
          }
        }
        else if (0 < lVar7) {
          pQVar8 = this->ptr;
          pQVar5 = pQVar8 + lVar7;
          do {
            pDVar2 = (pQVar8->chunk).d.d;
            (pQVar8->chunk).d.d = (Data *)0x0;
            local_48.ptr[local_48.size].chunk.d.d = pDVar2;
            pcVar3 = (pQVar8->chunk).d.ptr;
            (pQVar8->chunk).d.ptr = (char *)0x0;
            local_48.ptr[local_48.size].chunk.d.ptr = pcVar3;
            qVar4 = (pQVar8->chunk).d.size;
            (pQVar8->chunk).d.size = 0;
            local_48.ptr[local_48.size].chunk.d.size = qVar4;
            qVar4 = pQVar8->tailOffset;
            local_48.ptr[local_48.size].headOffset = pQVar8->headOffset;
            (&local_48.ptr[local_48.size].headOffset)[1] = qVar4;
            pQVar8 = pQVar8 + 1;
            local_48.size = local_48.size + 1;
          } while (pQVar8 < pQVar5);
        }
      }
      pDVar1 = this->d;
      pQVar5 = this->ptr;
      this->d = local_48.d;
      this->ptr = local_48.ptr;
      puVar6 = (undefined1 *)this->size;
      this->size = local_48.size;
      local_48.d = pDVar1;
      local_48.ptr = pQVar5;
      local_48.size = (qsizetype)puVar6;
      if (old != (QArrayDataPointer<QRingChunk> *)0x0) {
        local_48.d = old->d;
        local_48.ptr = old->ptr;
        old->d = pDVar1;
        old->ptr = pQVar5;
        local_48.size = old->size;
        old->size = (qsizetype)puVar6;
      }
      ~QArrayDataPointer(&local_48);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }